

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFunctionalTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::ShaderLibraryTest::~ShaderLibraryTest(ShaderLibraryTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderLibraryTest_021a39d0;
  pcVar2 = (this->m_filename)._M_dataplus._M_p;
  paVar1 = &(this->m_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  operator_delete(this,0x98);
  return;
}

Assistant:

ShaderLibraryTest (Context& context, const char* filename, const char* name, const char* description)
		: TestCaseGroup	(context, name, description)
		, m_filename	(filename)
	{
	}